

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall cmCTestMultiProcessHandler::CheckResume(cmCTestMultiProcessHandler *this)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  int index_00;
  ostream *poVar3;
  istream *piVar4;
  char *__nptr;
  string local_288 [4];
  int index;
  string line;
  ifstream fin;
  string local_50;
  undefined1 local_30 [8];
  string fname;
  cmCTestMultiProcessHandler *this_local;
  
  fname.field_2._8_8_ = this;
  cmCTest::GetBinaryDir_abi_cxx11_(&local_50,this->CTest);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 &local_50,"/Testing/Temporary/CTestCheckpoint.txt");
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = cmCTest::GetFailover(this->CTest);
  if (bVar1) {
    bVar1 = cmsys::SystemTools::FileExists((string *)local_30,true);
    if (bVar1) {
      poVar3 = std::operator<<(this->TestHandler->LogFile,"Resuming previously interrupted test set"
                              );
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"----------------------------------------------------------");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::ifstream::ifstream((void *)((long)&line.field_2 + 8));
      _Var2 = std::__cxx11::string::c_str();
      std::ifstream::open(line.field_2._M_local_buf + 8,_Var2);
      std::__cxx11::string::string(local_288);
      while( true ) {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)((long)&line.field_2 + 8),local_288);
        bVar1 = std::ios::operator_cast_to_bool
                          ((ios *)((long)&piVar4->_vptr_basic_istream +
                                  (long)piVar4->_vptr_basic_istream[-3]));
        if (!bVar1) break;
        __nptr = (char *)std::__cxx11::string::c_str();
        index_00 = atoi(__nptr);
        RemoveTest(this,index_00);
      }
      std::ifstream::close();
      std::__cxx11::string::~string(local_288);
      std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
    }
  }
  else {
    bVar1 = cmsys::SystemTools::FileExists((string *)local_30,true);
    if (bVar1) {
      cmsys::SystemTools::RemoveFile((string *)local_30);
    }
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::CheckResume()
{
  std::string fname =
    this->CTest->GetBinaryDir() + "/Testing/Temporary/CTestCheckpoint.txt";
  if (this->CTest->GetFailover()) {
    if (cmSystemTools::FileExists(fname, true)) {
      *this->TestHandler->LogFile
        << "Resuming previously interrupted test set" << std::endl
        << "----------------------------------------------------------"
        << std::endl;

      cmsys::ifstream fin;
      fin.open(fname.c_str());
      std::string line;
      while (std::getline(fin, line)) {
        int index = atoi(line.c_str());
        this->RemoveTest(index);
      }
      fin.close();
    }
  } else if (cmSystemTools::FileExists(fname, true)) {
    cmSystemTools::RemoveFile(fname);
  }
}